

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O1

char * rtosc_bundle_fetch(char *buffer,uint elm)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  ulong uVar4;
  bool bVar5;
  
  puVar3 = (uint *)(buffer + 0x10);
  bVar5 = elm == 0;
  if (!bVar5) {
    uVar1 = *(uint *)(buffer + 0x10);
    uVar1 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    if (uVar1 != 0) {
      uVar4 = (ulong)elm;
      do {
        puVar3 = (uint *)((long)puVar3 + (ulong)(uVar1 & 0xfffffffc) + 4);
        uVar4 = uVar4 - 1;
        bVar5 = uVar4 == 0;
        if (bVar5) break;
        uVar1 = *puVar3;
        uVar1 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      } while (uVar1 != 0);
    }
  }
  puVar2 = (uint *)0x0;
  if (bVar5) {
    puVar2 = puVar3 + 1;
  }
  return (char *)puVar2;
}

Assistant:

const char *rtosc_bundle_fetch(const char *buffer, unsigned elm)
{
    const uint32_t *lengths = (const uint32_t*) (buffer+16);
    size_t elm_pos = 0;
    while(elm_pos!=elm && extract_uint32((const uint8_t*)lengths)) {
        ++elm_pos;
        lengths += extract_uint32((const uint8_t*)lengths)/4+1;
    }

    return (const char*) (elm==elm_pos?lengths+1:NULL);
}